

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ImmediatePromiseNode<unsigned_long>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>(kj *this,unsigned_long *params)

{
  ImmediatePromiseNode<unsigned_long> *this_00;
  unsigned_long *value;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar1;
  ExceptionOr<unsigned_long> local_188;
  NoInfer<unsigned_long> *local_18;
  unsigned_long *params_local;
  
  local_18 = params;
  params_local = (unsigned_long *)this;
  this_00 = (ImmediatePromiseNode<unsigned_long> *)operator_new(0x178);
  value = fwd<unsigned_long>(local_18);
  _::ExceptionOr<unsigned_long>::ExceptionOr(&local_188,value);
  _::ImmediatePromiseNode<unsigned_long>::ImmediatePromiseNode(this_00,&local_188);
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_>::Own
            ((Own<kj::_::ImmediatePromiseNode<unsigned_long>_> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::_::ImmediatePromiseNode<unsigned_long>>::instance);
  _::ExceptionOr<unsigned_long>::~ExceptionOr(&local_188);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}